

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall SimpleLoggerMgr::flushAllLoggers(SimpleLoggerMgr *this)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  flushAllLoggers(this,0,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

EndOfStmt() {}